

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_ColorStop>::Append(ON_SimpleArray<ON_ColorStop> *this,ON_ColorStop *x)

{
  double dVar1;
  undefined4 uVar2;
  uint uVar3;
  ON_ColorStop *pOVar4;
  ON_ColorStop *pOVar5;
  uint uVar6;
  
  uVar3 = this->m_count;
  pOVar4 = x;
  if (uVar3 == this->m_capacity) {
    if ((int)uVar3 < 8 || (ulong)((long)(int)uVar3 * 0x10) < 0x10000001) {
      uVar6 = 4;
      if (2 < (int)uVar3) {
        uVar6 = uVar3 * 2;
      }
    }
    else {
      uVar6 = 0x1000008;
      if (uVar3 < 0x1000008) {
        uVar6 = uVar3;
      }
      uVar6 = uVar6 + uVar3;
    }
    if (x < this->m_a + (int)uVar3 && this->m_a <= x) {
      pOVar4 = (ON_ColorStop *)onmalloc(0x10);
      uVar2 = *(undefined4 *)&x->field_0x4;
      dVar1 = x->m_position;
      pOVar4->m_color = (ON_Color)(x->m_color).field_0;
      *(undefined4 *)&pOVar4->field_0x4 = uVar2;
      pOVar4->m_position = dVar1;
      uVar3 = this->m_capacity;
    }
    if (uVar3 < uVar6) {
      SetCapacity(this,(long)(int)uVar6);
    }
    pOVar5 = this->m_a;
    if (pOVar5 == (ON_ColorStop *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    uVar3 = this->m_count;
  }
  else {
    pOVar5 = this->m_a;
  }
  this->m_count = uVar3 + 1;
  uVar2 = *(undefined4 *)&pOVar4->field_0x4;
  dVar1 = pOVar4->m_position;
  pOVar5 = pOVar5 + (int)uVar3;
  pOVar5->m_color = (ON_Color)(pOVar4->m_color).field_0;
  *(undefined4 *)&pOVar5->field_0x4 = uVar2;
  pOVar5->m_position = dVar1;
  if (pOVar4 == x) {
    return;
  }
  onfree(pOVar4);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}